

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_logger__init(fct_logger_i *logger)

{
  fct_logger_i *logger_local;
  
  if (logger != (fct_logger_i *)0x0) {
    memcpy(logger,&fct_logger_default_vtable,0x58);
    memset(&logger->evt,0,0x38);
    return;
  }
  __assert_fail("logger != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0xa16,
                "void fct_logger__init(fct_logger_i *)");
}

Assistant:

static void
fct_logger__init(fct_logger_i *logger)
{
    FCT_ASSERT( logger != NULL );
    memcpy(
        &(logger->vtable),
        &fct_logger_default_vtable,
        sizeof(fct_logger_i_vtable_t)
    );
    memset(&(logger->evt),0, sizeof(fct_logger_evt_t));
}